

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

bool __thiscall
spirv_cross::CompilerGLSL::should_force_emit_builtin_block(CompilerGLSL *this,StorageClass storage)

{
  size_t sVar1;
  bool bVar2;
  bool bVar3;
  uint32_t uVar4;
  StorageClass SVar5;
  SPIRVariable *var;
  SPIRType *pSVar6;
  bool bVar7;
  TypedID<(spirv_cross::Types)0> *id;
  TypedID<(spirv_cross::Types)0> *pTVar8;
  uint32_t i;
  uint32_t uVar9;
  LoopLock LStack_48;
  ParsedIR *local_40;
  TypedID<(spirv_cross::Types)0> *local_38;
  
  if (storage == StorageClassOutput) {
    local_40 = &(this->super_Compiler).ir;
    ParsedIR::create_loop_hard_lock(local_40);
    pTVar8 = (this->super_Compiler).ir.ids_for_type[2].
             super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
    local_38 = pTVar8 + (this->super_Compiler).ir.ids_for_type[2].
                        super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
    bVar7 = false;
    for (; pTVar8 != local_38; pTVar8 = pTVar8 + 1) {
      if ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr[pTVar8->id].type
          == TypeVariable) {
        var = ParsedIR::get<spirv_cross::SPIRVariable>(local_40,pTVar8->id);
        if (!bVar7) {
          pSVar6 = Compiler::get<spirv_cross::SPIRType>
                             (&this->super_Compiler,*(uint32_t *)&(var->super_IVariant).field_0xc);
          bVar2 = Compiler::has_decoration
                            (&this->super_Compiler,(ID)(pSVar6->super_IVariant).self.id,
                             DecorationBlock);
          SVar5 = var->storage;
          if (bVar2 && SVar5 == StorageClassOutput) {
            bVar3 = Compiler::is_builtin_variable(&this->super_Compiler,var);
            if (bVar3) {
              sVar1 = (pSVar6->member_types).
                      super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size;
              for (uVar9 = 0; (uint32_t)sVar1 != uVar9; uVar9 = uVar9 + 1) {
                bVar2 = Compiler::has_member_decoration
                                  (&this->super_Compiler,(TypeID)(pSVar6->super_IVariant).self.id,
                                   uVar9,DecorationBuiltIn);
                if (bVar2) {
                  uVar4 = Compiler::get_member_decoration
                                    (&this->super_Compiler,(TypeID)(pSVar6->super_IVariant).self.id,
                                     uVar9,DecorationBuiltIn);
                  if ((uVar4 < 5) && (uVar4 != 2)) {
                    bVar2 = Compiler::has_member_decoration
                                      (&this->super_Compiler,
                                       (TypeID)(pSVar6->super_IVariant).self.id,uVar9,
                                       DecorationOffset);
                    if (bVar2) {
                      bVar7 = true;
                    }
                  }
                }
              }
              goto LAB_00211698;
            }
            SVar5 = var->storage;
          }
          if (!bVar2 && SVar5 == StorageClassOutput) {
            bVar2 = Compiler::is_builtin_variable(&this->super_Compiler,var);
            if (bVar2) {
              uVar9 = Compiler::get_decoration
                                (&this->super_Compiler,(ID)(pSVar6->super_IVariant).self.id,
                                 DecorationBuiltIn);
              if ((uVar9 < 5) && (uVar9 != 2)) {
                bVar2 = Compiler::has_decoration
                                  (&this->super_Compiler,(ID)(var->super_IVariant).self.id,
                                   DecorationOffset);
                if (bVar2) {
                  bVar7 = true;
                }
              }
            }
          }
        }
      }
LAB_00211698:
    }
    ParsedIR::LoopLock::~LoopLock(&LStack_48);
  }
  else {
    bVar7 = false;
  }
  return bVar7;
}

Assistant:

bool CompilerGLSL::should_force_emit_builtin_block(StorageClass storage)
{
	// If the builtin block uses XFB, we need to force explicit redeclaration of the builtin block.

	if (storage != StorageClassOutput)
		return false;
	bool should_force = false;

	ir.for_each_typed_id<SPIRVariable>([&](uint32_t, SPIRVariable &var) {
		if (should_force)
			return;

		auto &type = this->get<SPIRType>(var.basetype);
		bool block = has_decoration(type.self, DecorationBlock);
		if (var.storage == storage && block && is_builtin_variable(var))
		{
			uint32_t member_count = uint32_t(type.member_types.size());
			for (uint32_t i = 0; i < member_count; i++)
			{
				if (has_member_decoration(type.self, i, DecorationBuiltIn) &&
				    is_block_builtin(BuiltIn(get_member_decoration(type.self, i, DecorationBuiltIn))) &&
				    has_member_decoration(type.self, i, DecorationOffset))
				{
					should_force = true;
				}
			}
		}
		else if (var.storage == storage && !block && is_builtin_variable(var))
		{
			if (is_block_builtin(BuiltIn(get_decoration(type.self, DecorationBuiltIn))) &&
			    has_decoration(var.self, DecorationOffset))
			{
				should_force = true;
			}
		}
	});

	return should_force;
}